

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Writer.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP4Writer::BP4Writer(BP4Writer *this,IO *io,string *name,Mode mode,Comm *comm)

{
  Comm *comm_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  IO *pIVar2;
  int iVar3;
  Comm local_e0;
  ScopedTimer __var235;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  FileDrainerSingleThread *local_a0;
  BP4Serializer *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"BP4Writer","");
  helper::Comm::Comm(&local_e0,comm);
  Engine::Engine(&this->super_Engine,&local_50,io,name,mode,&local_e0);
  helper::Comm::~Comm(&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__BP4Writer_0086d180;
  comm_00 = &(this->super_Engine).m_Comm;
  adios2::format::BP4Serializer::BP4Serializer(&this->m_BP4Serializer,comm_00);
  local_98 = &this->m_BP4Serializer;
  transportman::TransportMan::TransportMan(&this->m_FileDataManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetadataManager,io,comm_00);
  transportman::TransportMan::TransportMan(&this->m_FileMetadataIndexManager,io,comm_00);
  this->m_WriteToBB = false;
  this->m_DrainBB = true;
  local_a0 = &this->m_FileDrainer;
  burstbuffer::FileDrainerSingleThread::FileDrainerSingleThread(local_a0);
  local_a8 = &(this->m_BBName).field_2;
  (this->m_BBName)._M_dataplus._M_p = (pointer)local_a8;
  (this->m_BBName)._M_string_length = 0;
  (this->m_BBName).field_2._M_local_buf[0] = '\0';
  memset(&this->m_SubStreamNames,0,0xad);
  if (BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)::
      __var35 == '\0') {
    iVar3 = __cxa_guard_acquire(&BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                                 ::__var35);
    if (iVar3 != 0) {
      BP4Writer::__var35 = (void *)ps_timer_create_("BP4Writer::Open");
      __cxa_guard_release(&BP4Writer(adios2::core::IO&,std::__cxx11::string_const&,adios2::Mode,adios2::helper::Comm)
                           ::__var35);
    }
  }
  __var235.m_timer = BP4Writer::__var35;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  pIVar2 = (this->super_Engine).m_IO;
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Verbose","");
  helper::GetParameter<int>(&pIVar2->m_Parameters,&local_d0,&this->m_Verbosity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BP4Writer","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Open","");
  iVar3 = helper::Comm::Rank(comm_00);
  helper::Log(&local_d0,&local_70,&local_90,&(this->super_Engine).m_Name,0,iVar3,5,this->m_Verbosity
              ,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  ((this->super_Engine).m_IO)->m_ReadStreaming = false;
  Init(this);
  (this->super_Engine).m_IsOpen = true;
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var235);
  return;
}

Assistant:

BP4Writer::BP4Writer(IO &io, const std::string &name, const Mode mode, helper::Comm comm)
: Engine("BP4Writer", io, name, mode, std::move(comm)), m_BP4Serializer(m_Comm),
  m_FileDataManager(io, m_Comm), m_FileMetadataManager(io, m_Comm),
  m_FileMetadataIndexManager(io, m_Comm), m_FileDrainer()
{
    PERFSTUBS_SCOPED_TIMER("BP4Writer::Open");
    helper::GetParameter(m_IO.m_Parameters, "Verbose", m_Verbosity);
    helper::Log("Engine", "BP4Writer", "Open", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    m_IO.m_ReadStreaming = false;

    Init();

    m_IsOpen = true;
}